

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O2

UBool ucnv_deleteSharedConverterData(UConverterSharedData *deadSharedData)

{
  UConverterUnload p_Var1;
  UBool in_AL;
  UBool extraout_AL;
  
  if (deadSharedData->referenceCounter != 0) {
    return in_AL;
  }
  p_Var1 = deadSharedData->impl->unload;
  if (p_Var1 != (UConverterUnload)0x0) {
    (*p_Var1)(deadSharedData);
  }
  if ((UDataMemory *)deadSharedData->dataMemory != (UDataMemory *)0x0) {
    udata_close_63((UDataMemory *)deadSharedData->dataMemory);
  }
  uprv_free_63(deadSharedData);
  return extraout_AL;
}

Assistant:

static UBool
ucnv_deleteSharedConverterData(UConverterSharedData * deadSharedData)
{
    UTRACE_ENTRY_OC(UTRACE_UCNV_UNLOAD);
    UTRACE_DATA2(UTRACE_OPEN_CLOSE, "unload converter %s shared data %p", deadSharedData->staticData->name, deadSharedData);

    if (deadSharedData->referenceCounter > 0) {
        UTRACE_EXIT_VALUE((int32_t)FALSE);
        return FALSE;
    }

    if (deadSharedData->impl->unload != NULL) {
        deadSharedData->impl->unload(deadSharedData);
    }

    if(deadSharedData->dataMemory != NULL)
    {
        UDataMemory *data = (UDataMemory*)deadSharedData->dataMemory;
        udata_close(data);
    }

    uprv_free(deadSharedData);

    UTRACE_EXIT_VALUE((int32_t)TRUE);
    return TRUE;
}